

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall
ON_BezierCurve::GetBoundingBox(ON_BezierCurve *this,ON_BoundingBox *bbox,int bGrowBox)

{
  bool bVar1;
  ON_3dPoint *pOStack_38;
  bool rc;
  double *boxmax;
  double *boxmin;
  void *heap_buffer;
  int bGrowBox_local;
  ON_BoundingBox *bbox_local;
  ON_BezierCurve *this_local;
  
  boxmin = (double *)0x0;
  if (this->m_dim < 4) {
    pOStack_38 = &bbox->m_max;
    boxmax = (double *)bbox;
  }
  else {
    boxmax = (double *)onmalloc((long)(this->m_dim << 1) << 3);
    memset(boxmax,0,(long)(this->m_dim << 1) << 3);
    pOStack_38 = (ON_3dPoint *)(boxmax + this->m_dim);
    boxmin = boxmax;
    if (bGrowBox != 0) {
      *boxmax = (bbox->m_min).x;
      boxmax[1] = (bbox->m_min).y;
      boxmax[2] = (bbox->m_min).z;
      pOStack_38->x = (bbox->m_max).x;
      pOStack_38->y = (bbox->m_max).y;
      pOStack_38->z = (bbox->m_max).z;
    }
  }
  bVar1 = GetBBox(this,boxmax,&pOStack_38->x,bGrowBox != 0);
  if ((bVar1) && (3 < this->m_dim)) {
    ON_3dPoint::operator=(&bbox->m_min,boxmax);
    ON_3dPoint::operator=(&bbox->m_max,&pOStack_38->x);
  }
  if (boxmin != (double *)0x0) {
    onfree(boxmin);
  }
  return bVar1;
}

Assistant:

bool ON_BezierCurve::GetBoundingBox( // returns true if successful
       ON_BoundingBox& bbox,
       int bGrowBox             // true means grow box
       ) const
{
  void* heap_buffer = 0;
  double *boxmin, *boxmax;
  
  if ( m_dim > 3 ) 
  {
    heap_buffer = onmalloc(2*m_dim*sizeof(*boxmin));
    boxmin = (double*)heap_buffer;
    memset( boxmin, 0, 2*m_dim*sizeof(*boxmin) );
    boxmax = boxmin + m_dim;
    if ( bGrowBox ) 
    {
      boxmin[0] = bbox.m_min.x;
      boxmin[1] = bbox.m_min.y;
      boxmin[2] = bbox.m_min.z;
      boxmax[0] = bbox.m_max.x;
      boxmax[1] = bbox.m_max.y;
      boxmax[2] = bbox.m_max.z;
    }
  }
  else 
  {
    boxmin = &bbox.m_min.x;
    boxmax = &bbox.m_max.x;
  }
  
  bool rc = GetBBox( boxmin, boxmax, bGrowBox );
  
  if ( rc && m_dim > 3 ) 
  {
    bbox.m_min = boxmin;
    bbox.m_max = boxmax;
  }

  if ( 0 != heap_buffer )
    onfree(heap_buffer);

  return rc;
}